

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_filter_ws<false>(Parser *this,substr r,size_t *i,size_t *pos)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  ro_substr chars;
  bool bVar4;
  error_flags eVar5;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  size_t first;
  char msg [44];
  char curr;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  char in_stack_fffffffffffffeb7;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  size_t in_stack_fffffffffffffec0;
  long *plVar6;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  basic_substring<char_const> local_f8 [16];
  ulong local_e8;
  char *local_c0;
  undefined1 local_b8 [47];
  char local_89;
  long *local_88;
  ulong *local_80;
  long local_70;
  ulong local_68;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  long *local_48;
  char *local_40;
  undefined4 local_38;
  ulong local_30;
  long *local_28;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_10 = *in_RCX;
  local_8 = &local_70;
  local_88 = in_R8;
  local_80 = in_RCX;
  local_70 = in_RSI;
  local_68 = in_RDX;
  if (in_RDX <= local_10) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x14c3;
    handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  local_89 = *(char *)(local_70 + local_10);
  if ((local_89 != ' ') && (local_89 != '\t')) {
    memcpy(local_b8,"check failed: (curr == \' \' || curr == \'\\t\')",0x2c);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8,
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    (*pcVar1)(local_b8,0x2c,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffea8 = local_c0;
  }
  if (*local_80 == 0) {
    local_e8 = basic_substring<char>::first_not_of
                         ((basic_substring<char> *)
                          CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                          in_stack_fffffffffffffeb7,(size_t)in_stack_fffffffffffffea8);
  }
  else {
    basic_substring<char_const>::basic_substring<3ul>(local_f8,(char (*) [3])" \t");
    chars.len = in_stack_fffffffffffffed8;
    chars.str = in_stack_fffffffffffffed0;
    local_e8 = basic_substring<char>::first_not_of
                         ((basic_substring<char> *)
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),chars,
                          in_stack_fffffffffffffec0);
  }
  if (local_e8 == 0xffffffffffffffff) {
    *local_80 = local_68;
  }
  else {
    plVar6 = &local_70;
    local_30 = local_e8;
    local_28 = plVar6;
    if (local_68 <= local_e8) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x14c3;
      handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    if (*(char *)(*plVar6 + local_30) != '\n') {
      plVar6 = &local_70;
      local_50 = local_e8;
      if (local_68 <= local_e8) {
        local_48 = plVar6;
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          trap_instruction();
        }
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x14c3;
        handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (*(char *)(*plVar6 + local_50) != '\r') {
        lVar2 = *(long *)(in_RDI + 0xa78);
        lVar3 = *local_88;
        *local_88 = lVar3 + 1;
        *(char *)(lVar2 + lVar3) = local_89;
        return;
      }
    }
    *local_80 = local_e8 - 1;
  }
  return;
}

Assistant:

void Parser::_filter_ws(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfws(fmt, ...) _c4dbgpf("filt_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfws(...)
    #endif

    const char curr = r[*i];
    _c4dbgfws("found whitespace '{}'", _c4prc(curr));
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == ' ' || curr == '\t');

    size_t first = *i > 0 ? r.first_not_of(" \t", *i) : r.first_not_of(' ', *i);
    if(first != npos)
    {
        if(r[first] == '\n' || r[first] == '\r') // skip trailing whitespace
        {
            _c4dbgfws("whitespace is trailing on line. firstnonws='{}'@{}", _c4prc(r[first]), first);
            *i = first - 1; // correct for the loop increment
        }
        else // a legit whitespace
        {
            m_filter_arena.str[(*pos)++] = curr;
            _c4dbgfws("legit whitespace. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
        }
    }
    else
    {
        _c4dbgfws("... everything else is trailing whitespace{}", "");
        if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            for(size_t j = *i; j < r.len; ++j)
                m_filter_arena.str[(*pos)++] = r[j];
        *i = r.len;
    }

    #undef _c4dbgfws
}